

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix2f> *value)

{
  bool bVar1;
  undefined1 local_34 [8];
  matrix2f v;
  optional<tinyusdz::value::matrix2f> *value_local;
  AsciiParser *this_local;
  
  unique0x1000007d = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::matrix2f>::operator=(stack0xffffffffffffffe0);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::matrix2f::matrix2f((matrix2f *)local_34);
    bVar1 = ReadBasicType(this,(matrix2f *)local_34);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix2f>::operator=
                (stack0xffffffffffffffe0,(matrix2f *)local_34);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix2f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix2f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}